

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  undefined2 *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined2 *puVar15;
  ulong uVar16;
  int iVar17;
  undefined2 *puVar18;
  undefined2 *puVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  char cVar27;
  void *pvVar28;
  bool bVar29;
  BIT_DStream_t local_1b0;
  BIT_DStream_t local_188;
  BIT_DStream_t local_160;
  BIT_DStream_t local_138;
  undefined2 *local_110;
  undefined2 *local_100;
  int local_f4;
  size_t *local_f0;
  undefined2 *local_e8;
  size_t *local_e0;
  ulong local_d8;
  undefined2 *local_d0;
  size_t local_c8;
  size_t *local_c0;
  undefined2 *local_b8;
  size_t local_a8;
  size_t local_90;
  size_t local_88;
  
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar22 = (ulong)*cSrc;
  uVar16 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar21 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar9 = uVar22 + uVar16 + uVar21 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar9) {
    return 0xffffffffffffffec;
  }
  local_100 = (undefined2 *)((long)dst + dstSize);
  uVar14 = dstSize + 3 >> 2;
  local_110 = (undefined2 *)((long)dst + uVar14);
  local_d0 = (undefined2 *)((long)local_110 + uVar14);
  puVar15 = (undefined2 *)(uVar14 + (long)local_d0);
  if (local_100 < puVar15) {
    return 0xffffffffffffffec;
  }
  local_d8 = (ulong)*DTable;
  local_b8 = (undefined2 *)dst;
  local_a8 = dstSize;
  sVar10 = BIT_initDStream(&local_160,(void *)((long)cSrc + 6),uVar22);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar28 = (void *)((long)cSrc + uVar22 + 6);
  sVar10 = BIT_initDStream(&local_188,pvVar28,uVar16);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar28 = (void *)((long)pvVar28 + uVar16);
  sVar10 = BIT_initDStream(&local_1b0,pvVar28,uVar21);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  sVar10 = BIT_initDStream(&local_138,(void *)((long)pvVar28 + uVar21),cSrcSize - uVar9);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puVar11 = (undefined2 *)((long)local_b8 + (local_a8 - 7));
  uVar9 = local_d8 >> 0x10 & 0xffff;
  uVar13 = (uint)uVar9;
  puVar18 = local_d0;
  puVar19 = puVar15;
  local_e8 = local_110;
  if (7 < (ulong)((long)local_100 - (long)puVar15)) {
    local_88 = local_188.bitContainer;
    local_c8 = local_1b0.bitContainer;
    local_90 = local_138.bitContainer;
    uVar20 = -uVar13 & 0x3f;
    local_c0 = (size_t *)local_160.ptr;
    local_f0 = (size_t *)local_188.ptr;
    bVar29 = true;
    sVar10 = local_160.bitContainer;
    while( true ) {
      if ((puVar11 <= puVar19) || (!bVar29)) break;
      uVar16 = (sVar10 << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar20;
      *local_b8 = (short)DTable[uVar16 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar21 = (sVar10 << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_b8 + uVar16) = (short)DTable[uVar21 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_160.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      lVar4 = uVar21 + uVar16;
      uVar22 = (sVar10 << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_b8 + uVar21 + uVar16) = (short)DTable[uVar22 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar22 * 4 + 6) + local_160.bitsConsumed;
      uVar22 = (ulong)*(byte *)((long)DTable + uVar22 * 4 + 7);
      uVar16 = (sVar10 << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_b8 + uVar22 + lVar4) = (short)DTable[uVar16 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
      bVar1 = *(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_88 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar20;
      *local_e8 = (short)DTable[uVar16 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar21 = (local_88 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_e8 + uVar16) = (short)DTable[uVar21 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar21 * 4 + 6) + local_188.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar21 * 4 + 7);
      uVar14 = (local_88 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_e8 + uVar21 + uVar16) = (short)DTable[uVar14 + 1];
      lVar5 = uVar21 + uVar16;
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar14 * 4 + 6) + local_188.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
      uVar16 = (local_88 << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)local_e8 + uVar21 + lVar5) = (short)DTable[uVar16 + 1];
      if (local_c0 < local_160.limitPtr) {
        local_f4 = 3;
      }
      else {
        local_c0 = (size_t *)((long)local_c0 - (ulong)(local_160.bitsConsumed >> 3));
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
        sVar10 = *local_c0;
        local_f4 = 0;
        local_160.bitContainer = sVar10;
      }
      local_188.bitsConsumed = local_188.bitsConsumed + *(byte *)((long)DTable + uVar16 * 4 + 6);
      bVar2 = *(byte *)((long)DTable + uVar16 * 4 + 7);
      if (local_f0 < local_188.limitPtr) {
        iVar25 = 3;
      }
      else {
        local_f0 = (size_t *)((long)local_f0 - (ulong)(local_188.bitsConsumed >> 3));
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
        local_188.bitContainer = *local_f0;
        iVar25 = 0;
        local_88 = local_188.bitContainer;
      }
      uVar16 = (local_c8 << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar20;
      *puVar18 = (short)DTable[uVar16 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar14 = (local_c8 << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar18 + uVar16) = (short)DTable[uVar14 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar14 * 4 + 6) + local_1b0.bitsConsumed;
      uVar14 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
      lVar6 = uVar14 + uVar16;
      uVar23 = (local_c8 << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar18 + uVar14 + uVar16) = (short)DTable[uVar23 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar23 * 4 + 6) + local_1b0.bitsConsumed;
      uVar23 = (ulong)*(byte *)((long)DTable + uVar23 * 4 + 7);
      uVar16 = (local_c8 << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar18 + uVar23 + lVar6) = (short)DTable[uVar16 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
      bVar3 = *(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_90 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *puVar19 = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar14 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_90 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar14) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar24 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_90 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar24 + uVar14) = (short)DTable[uVar16 + 1];
      lVar7 = uVar24 + uVar14;
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar14 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_90 << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar14 + lVar7) = (short)DTable[uVar16 + 1];
      if (local_1b0.ptr < local_1b0.limitPtr) {
        iVar17 = 3;
      }
      else {
        local_1b0.ptr = (char *)((long)local_1b0.ptr - (ulong)(local_1b0.bitsConsumed >> 3));
        local_1b0.bitsConsumed = local_1b0.bitsConsumed & 7;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
        iVar17 = 0;
        local_c8 = local_1b0.bitContainer;
      }
      local_138.bitsConsumed = local_138.bitsConsumed + *(byte *)((long)DTable + uVar16 * 4 + 6);
      if (local_138.ptr < local_138.limitPtr) {
        iVar26 = 3;
        local_e0 = (size_t *)local_138.ptr;
      }
      else {
        local_e0 = (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        local_138.bitContainer = *local_e0;
        iVar26 = 0;
        local_90 = local_138.bitContainer;
      }
      local_b8 = (undefined2 *)((long)local_b8 + (ulong)bVar1 + uVar22 + lVar4);
      local_e8 = (undefined2 *)((long)local_e8 + (ulong)bVar2 + uVar21 + lVar5);
      puVar18 = (undefined2 *)((long)puVar18 + (ulong)bVar3 + uVar23 + lVar6);
      puVar19 = (undefined2 *)
                ((long)puVar19 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar14 + lVar7);
      bVar29 = ((iVar25 == 0 && local_f4 == 0) && iVar17 == 0) && iVar26 == 0;
      local_138.ptr = (char *)local_e0;
    }
    local_160.ptr = (char *)local_c0;
    local_188.ptr = (char *)local_f0;
  }
  if (local_110 < local_b8) {
    return 0xffffffffffffffec;
  }
  if (local_d0 < local_e8) {
    return 0xffffffffffffffec;
  }
  if (puVar15 < puVar18) {
    return 0xffffffffffffffec;
  }
  cVar27 = (char)uVar9;
  uVar20 = uVar13 & 0xff;
  iVar25 = (int)local_160.start;
  if ((ulong)((long)local_110 - (long)local_b8) < 8) {
    uVar9 = (ulong)local_160.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) goto LAB_001a8e01;
        uVar8 = (int)local_160.ptr - iVar25;
        if (local_160.start <=
            (size_t *)((long)local_160.ptr - (ulong)(local_160.bitsConsumed >> 3))) {
          uVar8 = local_160.bitsConsumed >> 3;
        }
        local_160.bitsConsumed = local_160.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_160.bitsConsumed >> 3;
        local_160.bitsConsumed = local_160.bitsConsumed & 7;
      }
      local_160.ptr = (char *)((long)local_160.ptr - (ulong)uVar8);
      uVar9 = (ulong)local_160.bitsConsumed;
      local_160.bitContainer = *(size_t *)local_160.ptr;
    }
  }
  else {
    uVar8 = -uVar13 & 0x3f;
    uVar9 = (ulong)local_160.bitsConsumed;
    if (uVar20 < 0xc) {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_160.ptr < local_160.limitPtr) {
          if (local_160.ptr == local_160.start) break;
          bVar29 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_160.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_160.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_160.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_160.ptr = (char *)((long)local_160.ptr - uVar16);
        uVar9 = (ulong)local_160.bitsConsumed;
        local_160.bitContainer = *(size_t *)local_160.ptr;
        if (((undefined2 *)((long)local_110 + -9) <= local_b8) || (!bVar29)) break;
        uVar9 = (local_160.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *local_b8 = (short)DTable[uVar9 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar9) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar5 = uVar9 + lVar4;
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar9 + lVar4) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar9 + lVar5) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        local_b8 = (undefined2 *)
                   ((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar9 + lVar5
                   );
        uVar9 = (ulong)local_160.bitsConsumed;
      }
    }
    else {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_160.ptr < local_160.limitPtr) {
          if (local_160.ptr == local_160.start) break;
          bVar29 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_160.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_160.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_160.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_160.ptr = (char *)((long)local_160.ptr - uVar16);
        uVar9 = (ulong)local_160.bitsConsumed;
        local_160.bitContainer = *(size_t *)local_160.ptr;
        if (((undefined2 *)((long)local_110 + -7) <= local_b8) || (!bVar29)) break;
        uVar9 = (local_160.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *local_b8 = (short)DTable[uVar9 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar9) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar9 = (local_160.bitContainer << ((ulong)local_160.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_b8 + uVar16 + lVar4) = (short)DTable[uVar9 + 1];
        local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
        local_b8 = (undefined2 *)
                   ((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7) + uVar16 + lVar4
                   );
        uVar9 = (ulong)local_160.bitsConsumed;
      }
    }
  }
LAB_001a8e01:
  if (1 < (ulong)((long)local_110 - (long)local_b8)) {
    while (uVar8 = (uint)uVar9, uVar8 < 0x41) {
      if (local_160.ptr < local_160.limitPtr) {
        if (local_160.ptr == local_160.start) break;
        bVar29 = local_160.start <= (size_t *)((long)local_160.ptr - (uVar9 >> 3));
        uVar16 = (ulong)(uint)((int)local_160.ptr - iVar25);
        if (bVar29) {
          uVar16 = uVar9 >> 3;
        }
        local_160.bitsConsumed = uVar8 + (int)uVar16 * -8;
      }
      else {
        uVar16 = uVar9 >> 3;
        local_160.bitsConsumed = uVar8 & 7;
        bVar29 = true;
      }
      local_160.ptr = (char *)((long)local_160.ptr - uVar16);
      uVar9 = (ulong)local_160.bitsConsumed;
      local_160.bitContainer = *(size_t *)local_160.ptr;
      if ((local_110 + -1 < local_b8) || (!bVar29)) break;
      uVar9 = (local_160.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *local_b8 = (short)DTable[uVar9 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
      local_b8 = (undefined2 *)((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_160.bitsConsumed;
    }
    for (; local_b8 <= local_110 + -1;
        local_b8 = (undefined2 *)((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7)))
    {
      uVar16 = (local_160.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *local_b8 = (short)DTable[uVar16 + 1];
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_160.bitsConsumed;
      uVar9 = (ulong)local_160.bitsConsumed;
    }
  }
  if (local_b8 < local_110) {
    uVar9 = (local_160.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-cVar27 & 0x3f);
    *(char *)local_b8 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_160.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_160.bitsConsumed;
    }
    else if (local_160.bitsConsumed < 0x40) {
      local_160.bitsConsumed = local_160.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
      if (0x3f < local_160.bitsConsumed) {
        local_160.bitsConsumed = 0x40;
      }
    }
  }
  iVar25 = (int)local_188.start;
  if ((ulong)((long)local_d0 - (long)local_e8) < 8) {
    uVar9 = (ulong)local_188.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) goto LAB_001a92d2;
        uVar8 = (int)local_188.ptr - iVar25;
        if (local_188.start <=
            (size_t *)((long)local_188.ptr - (ulong)(local_188.bitsConsumed >> 3))) {
          uVar8 = local_188.bitsConsumed >> 3;
        }
        local_188.bitsConsumed = local_188.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_188.bitsConsumed >> 3;
        local_188.bitsConsumed = local_188.bitsConsumed & 7;
      }
      local_188.ptr = (char *)((long)local_188.ptr - (ulong)uVar8);
      uVar9 = (ulong)local_188.bitsConsumed;
      local_188.bitContainer = *(size_t *)local_188.ptr;
    }
  }
  else {
    uVar8 = -uVar13 & 0x3f;
    uVar9 = (ulong)local_188.bitsConsumed;
    if (uVar20 < 0xc) {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_188.ptr < local_188.limitPtr) {
          if (local_188.ptr == local_188.start) break;
          bVar29 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_188.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_188.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_188.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_188.ptr = (char *)((long)local_188.ptr - uVar16);
        uVar9 = (ulong)local_188.bitsConsumed;
        local_188.bitContainer = *(size_t *)local_188.ptr;
        if (((undefined2 *)((long)local_d0 - 9U) <= local_e8) || (!bVar29)) break;
        uVar9 = (local_188.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *local_e8 = (short)DTable[uVar9 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar9) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar5 = uVar9 + lVar4;
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar9 + lVar4) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar9 + lVar5) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        local_e8 = (undefined2 *)
                   ((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar9 + lVar5
                   );
        uVar9 = (ulong)local_188.bitsConsumed;
      }
    }
    else {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_188.ptr < local_188.limitPtr) {
          if (local_188.ptr == local_188.start) break;
          bVar29 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_188.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_188.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_188.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_188.ptr = (char *)((long)local_188.ptr - uVar16);
        uVar9 = (ulong)local_188.bitsConsumed;
        local_188.bitContainer = *(size_t *)local_188.ptr;
        if (((undefined2 *)((long)local_d0 - 7U) <= local_e8) || (!bVar29)) break;
        uVar9 = (local_188.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *local_e8 = (short)DTable[uVar9 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar9) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar9 = (local_188.bitContainer << ((ulong)local_188.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)local_e8 + uVar16 + lVar4) = (short)DTable[uVar9 + 1];
        local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
        local_e8 = (undefined2 *)
                   ((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7) + uVar16 + lVar4
                   );
        uVar9 = (ulong)local_188.bitsConsumed;
      }
    }
  }
LAB_001a92d2:
  if (1 < (ulong)((long)local_d0 - (long)local_e8)) {
    while (uVar8 = (uint)uVar9, uVar8 < 0x41) {
      if (local_188.ptr < local_188.limitPtr) {
        if (local_188.ptr == local_188.start) break;
        bVar29 = local_188.start <= (size_t *)((long)local_188.ptr - (uVar9 >> 3));
        uVar16 = (ulong)(uint)((int)local_188.ptr - iVar25);
        if (bVar29) {
          uVar16 = uVar9 >> 3;
        }
        local_188.bitsConsumed = uVar8 + (int)uVar16 * -8;
      }
      else {
        uVar16 = uVar9 >> 3;
        local_188.bitsConsumed = uVar8 & 7;
        bVar29 = true;
      }
      local_188.ptr = (char *)((long)local_188.ptr - uVar16);
      uVar9 = (ulong)local_188.bitsConsumed;
      local_188.bitContainer = *(size_t *)local_188.ptr;
      if ((local_d0 + -1 < local_e8) || (!bVar29)) break;
      uVar9 = (local_188.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *local_e8 = (short)DTable[uVar9 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
      local_e8 = (undefined2 *)((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_188.bitsConsumed;
    }
    for (; local_e8 <= local_d0 + -1;
        local_e8 = (undefined2 *)((long)local_e8 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7)))
    {
      uVar16 = (local_188.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *local_e8 = (short)DTable[uVar16 + 1];
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_188.bitsConsumed;
      uVar9 = (ulong)local_188.bitsConsumed;
    }
  }
  if (local_e8 < local_d0) {
    uVar9 = (local_188.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-cVar27 & 0x3f);
    *(char *)local_e8 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_188.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_188.bitsConsumed;
    }
    else if (local_188.bitsConsumed < 0x40) {
      local_188.bitsConsumed = local_188.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
      if (0x3f < local_188.bitsConsumed) {
        local_188.bitsConsumed = 0x40;
      }
    }
  }
  iVar25 = (int)local_1b0.start;
  if ((ulong)((long)puVar15 - (long)puVar18) < 8) {
    uVar9 = (ulong)local_1b0.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_1b0.ptr < local_1b0.limitPtr) {
        if (local_1b0.ptr == local_1b0.start) goto LAB_001a978d;
        uVar8 = (int)local_1b0.ptr - iVar25;
        if (local_1b0.start <=
            (size_t *)((long)local_1b0.ptr - (ulong)(local_1b0.bitsConsumed >> 3))) {
          uVar8 = local_1b0.bitsConsumed >> 3;
        }
        local_1b0.bitsConsumed = local_1b0.bitsConsumed + uVar8 * -8;
      }
      else {
        uVar8 = local_1b0.bitsConsumed >> 3;
        local_1b0.bitsConsumed = local_1b0.bitsConsumed & 7;
      }
      local_1b0.ptr = (char *)((long)local_1b0.ptr - (ulong)uVar8);
      uVar9 = (ulong)local_1b0.bitsConsumed;
      local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
    }
  }
  else {
    uVar8 = -uVar13 & 0x3f;
    uVar9 = (ulong)local_1b0.bitsConsumed;
    if (uVar20 < 0xc) {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_1b0.ptr < local_1b0.limitPtr) {
          if (local_1b0.ptr == local_1b0.start) break;
          bVar29 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_1b0.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_1b0.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_1b0.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar16);
        uVar9 = (ulong)local_1b0.bitsConsumed;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
        if (((undefined2 *)((long)puVar15 + -9) <= puVar18) || (!bVar29)) break;
        uVar9 = (local_1b0.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *puVar18 = (short)DTable[uVar9 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar9) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar5 = uVar9 + lVar4;
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar9 + lVar4) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar9 + lVar5) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        puVar18 = (undefined2 *)
                  ((long)puVar18 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar9 + lVar5);
        uVar9 = (ulong)local_1b0.bitsConsumed;
      }
    }
    else {
      while (uVar12 = (uint)uVar9, uVar12 < 0x41) {
        if (local_1b0.ptr < local_1b0.limitPtr) {
          if (local_1b0.ptr == local_1b0.start) break;
          bVar29 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
          uVar16 = (ulong)(uint)((int)local_1b0.ptr - iVar25);
          if (bVar29) {
            uVar16 = uVar9 >> 3;
          }
          local_1b0.bitsConsumed = uVar12 + (int)uVar16 * -8;
        }
        else {
          uVar16 = uVar9 >> 3;
          local_1b0.bitsConsumed = uVar12 & 7;
          bVar29 = true;
        }
        local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar16);
        uVar9 = (ulong)local_1b0.bitsConsumed;
        local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
        if (((undefined2 *)((long)puVar15 + -7) <= puVar18) || (!bVar29)) break;
        uVar9 = (local_1b0.bitContainer << (uVar9 & 0x3f)) >> uVar8;
        *puVar18 = (short)DTable[uVar9 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar9) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar4 = uVar21 + uVar9;
        uVar16 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar9 = (local_1b0.bitContainer << ((ulong)local_1b0.bitsConsumed & 0x3f)) >> uVar8;
        *(short *)((long)puVar18 + uVar16 + lVar4) = (short)DTable[uVar9 + 1];
        local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
        puVar18 = (undefined2 *)
                  ((long)puVar18 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7) + uVar16 + lVar4);
        uVar9 = (ulong)local_1b0.bitsConsumed;
      }
    }
  }
LAB_001a978d:
  if (1 < (ulong)((long)puVar15 - (long)puVar18)) {
    while (uVar8 = (uint)uVar9, uVar8 < 0x41) {
      if (local_1b0.ptr < local_1b0.limitPtr) {
        if (local_1b0.ptr == local_1b0.start) break;
        bVar29 = local_1b0.start <= (size_t *)((long)local_1b0.ptr - (uVar9 >> 3));
        uVar16 = (ulong)(uint)((int)local_1b0.ptr - iVar25);
        if (bVar29) {
          uVar16 = uVar9 >> 3;
        }
        local_1b0.bitsConsumed = uVar8 + (int)uVar16 * -8;
      }
      else {
        uVar16 = uVar9 >> 3;
        local_1b0.bitsConsumed = uVar8 & 7;
        bVar29 = true;
      }
      local_1b0.ptr = (char *)((long)local_1b0.ptr - uVar16);
      uVar9 = (ulong)local_1b0.bitsConsumed;
      local_1b0.bitContainer = *(size_t *)local_1b0.ptr;
      if ((puVar15 + -1 < puVar18) || (!bVar29)) break;
      uVar9 = (local_1b0.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *puVar18 = (short)DTable[uVar9 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
      puVar18 = (undefined2 *)((long)puVar18 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_1b0.bitsConsumed;
    }
    for (; puVar18 <= puVar15 + -1;
        puVar18 = (undefined2 *)((long)puVar18 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7))) {
      uVar16 = (local_1b0.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *puVar18 = (short)DTable[uVar16 + 1];
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_1b0.bitsConsumed;
      uVar9 = (ulong)local_1b0.bitsConsumed;
    }
  }
  if (puVar18 < puVar15) {
    uVar9 = (local_1b0.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-cVar27 & 0x3f);
    *(char *)puVar18 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      local_1b0.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_1b0.bitsConsumed;
    }
    else if (local_1b0.bitsConsumed < 0x40) {
      local_1b0.bitsConsumed = local_1b0.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
      if (0x3f < local_1b0.bitsConsumed) {
        local_1b0.bitsConsumed = 0x40;
      }
    }
  }
  iVar25 = (int)local_138.start;
  if ((ulong)((long)local_100 - (long)puVar19) < 8) {
    uVar9 = (ulong)local_138.bitsConsumed;
    if (uVar9 < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) goto LAB_001a9cd2;
        uVar20 = (int)local_138.ptr - iVar25;
        if (local_138.start <=
            (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3))) {
          uVar20 = local_138.bitsConsumed >> 3;
        }
        local_138.bitsConsumed = local_138.bitsConsumed + uVar20 * -8;
      }
      else {
        uVar20 = local_138.bitsConsumed >> 3;
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
      }
      local_138.ptr = (char *)((long)local_138.ptr - (ulong)uVar20);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
    }
  }
  else if (uVar20 < 0xc) {
    uVar20 = -uVar13 & 0x3f;
    for (; uVar9 = (ulong)local_138.bitsConsumed, local_138.bitsConsumed < 0x41;
        local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed)
    {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar29 = local_138.start <=
                 (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        uVar9 = (ulong)(uint)((int)local_138.ptr - iVar25);
        if (bVar29) {
          uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        }
        local_138.bitsConsumed = local_138.bitsConsumed + (int)uVar9 * -8;
      }
      else {
        uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        bVar29 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar9);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if (((undefined2 *)((long)local_100 + -9) <= puVar19) || (!bVar29)) break;
      uVar9 = (local_138.bitContainer << (uVar9 & 0x3f)) >> uVar20;
      *puVar19 = (short)DTable[uVar9 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar9) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar4 = uVar21 + uVar9;
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar5 = uVar9 + lVar4;
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar9 + lVar4) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar9 + lVar5) = (short)DTable[uVar16 + 1];
      puVar19 = (undefined2 *)
                ((long)puVar19 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar9 + lVar5);
    }
  }
  else {
    uVar20 = -uVar13 & 0x3f;
    for (; uVar9 = (ulong)local_138.bitsConsumed, local_138.bitsConsumed < 0x41;
        local_138.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar29 = local_138.start <=
                 (size_t *)((long)local_138.ptr - (ulong)(local_138.bitsConsumed >> 3));
        uVar9 = (ulong)(uint)((int)local_138.ptr - iVar25);
        if (bVar29) {
          uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        }
        local_138.bitsConsumed = local_138.bitsConsumed + (int)uVar9 * -8;
      }
      else {
        uVar9 = (ulong)(local_138.bitsConsumed >> 3);
        local_138.bitsConsumed = local_138.bitsConsumed & 7;
        bVar29 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar9);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if ((puVar11 <= puVar19) || (!bVar29)) break;
      uVar9 = (local_138.bitContainer << (uVar9 & 0x3f)) >> uVar20;
      *puVar19 = (short)DTable[uVar9 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar9) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar21 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar4 = uVar21 + uVar9;
      uVar16 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar21 + uVar9) = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar9 = (local_138.bitContainer << ((ulong)local_138.bitsConsumed & 0x3f)) >> uVar20;
      *(short *)((long)puVar19 + uVar16 + lVar4) = (short)DTable[uVar9 + 1];
      puVar19 = (undefined2 *)
                ((long)puVar19 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7) + uVar16 + lVar4);
    }
  }
LAB_001a9cd2:
  if (1 < (ulong)((long)local_100 - (long)puVar19)) {
    while (uVar20 = (uint)uVar9, uVar20 < 0x41) {
      if (local_138.ptr < local_138.limitPtr) {
        if (local_138.ptr == local_138.start) break;
        bVar29 = local_138.start <= (size_t *)((long)local_138.ptr - (uVar9 >> 3));
        uVar16 = (ulong)(uint)((int)local_138.ptr - iVar25);
        if (bVar29) {
          uVar16 = uVar9 >> 3;
        }
        local_138.bitsConsumed = uVar20 + (int)uVar16 * -8;
      }
      else {
        uVar16 = uVar9 >> 3;
        local_138.bitsConsumed = uVar20 & 7;
        bVar29 = true;
      }
      local_138.ptr = (char *)((long)local_138.ptr - uVar16);
      uVar9 = (ulong)local_138.bitsConsumed;
      local_138.bitContainer = *(size_t *)local_138.ptr;
      if ((local_100 + -1 < puVar19) || (!bVar29)) break;
      uVar9 = (local_138.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *puVar19 = (short)DTable[uVar9 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
      puVar19 = (undefined2 *)((long)puVar19 + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      uVar9 = (ulong)local_138.bitsConsumed;
    }
    for (; puVar19 <= local_100 + -1;
        puVar19 = (undefined2 *)((long)puVar19 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7))) {
      uVar16 = (local_138.bitContainer << (uVar9 & 0x3f)) >> (-uVar13 & 0x3f);
      *puVar19 = (short)DTable[uVar16 + 1];
      local_138.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_138.bitsConsumed;
      uVar9 = (ulong)local_138.bitsConsumed;
    }
  }
  uVar13 = (uint)uVar9;
  if (puVar19 < local_100) {
    uVar9 = (local_138.bitContainer << (uVar9 & 0x3f)) >> ((ulong)(byte)-cVar27 & 0x3f);
    *(char *)puVar19 = (char)DTable[uVar9 + 1];
    if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
      uVar13 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_138.bitsConsumed;
    }
    else {
      uVar13 = local_138.bitsConsumed;
      if (local_138.bitsConsumed < 0x40) {
        local_138.bitsConsumed = local_138.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
        uVar13 = 0x40;
        if (local_138.bitsConsumed < 0x40) {
          uVar13 = local_138.bitsConsumed;
        }
      }
    }
  }
  sVar10 = 0xffffffffffffffec;
  if (uVar13 != 0x40) {
    local_a8 = sVar10;
  }
  if (local_138.ptr != local_138.start) {
    local_a8 = sVar10;
  }
  if (local_1b0.bitsConsumed != 0x40) {
    local_a8 = sVar10;
  }
  if (local_1b0.ptr != local_1b0.start) {
    local_a8 = sVar10;
  }
  if (local_188.bitsConsumed != 0x40) {
    local_a8 = sVar10;
  }
  if (local_188.ptr != local_188.start) {
    local_a8 = sVar10;
  }
  if (local_160.bitsConsumed != 0x40) {
    local_a8 = sVar10;
  }
  if (local_160.ptr != local_160.start) {
    local_a8 = sVar10;
  }
  return local_a8;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_decompress4X2_usingDTable_internal_body(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    if (cSrcSize < 10) return ERROR(corruption_detected);   /* strict minimum : jump table + 1 byte per stream */

    {   const BYTE* const istart = (const BYTE*) cSrc;
        BYTE* const ostart = (BYTE*) dst;
        BYTE* const oend = ostart + dstSize;
        BYTE* const olimit = oend - (sizeof(size_t)-1);
        const void* const dtPtr = DTable+1;
        const HUF_DEltX2* const dt = (const HUF_DEltX2*)dtPtr;

        /* Init */
        BIT_DStream_t bitD1;
        BIT_DStream_t bitD2;
        BIT_DStream_t bitD3;
        BIT_DStream_t bitD4;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = cSrcSize - (length1 + length2 + length3 + 6);
        const BYTE* const istart1 = istart + 6;  /* jumpTable */
        const BYTE* const istart2 = istart1 + length1;
        const BYTE* const istart3 = istart2 + length2;
        const BYTE* const istart4 = istart3 + length3;
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* const opStart2 = ostart + segmentSize;
        BYTE* const opStart3 = opStart2 + segmentSize;
        BYTE* const opStart4 = opStart3 + segmentSize;
        BYTE* op1 = ostart;
        BYTE* op2 = opStart2;
        BYTE* op3 = opStart3;
        BYTE* op4 = opStart4;
        U32 endSignal = 1;
        DTableDesc const dtd = HUF_getDTableDesc(DTable);
        U32 const dtLog = dtd.tableLog;

        if (length4 > cSrcSize) return ERROR(corruption_detected);  /* overflow */
        if (opStart4 > oend) return ERROR(corruption_detected);     /* overflow */
        if (dstSize < 6) return ERROR(corruption_detected);         /* stream 4-split doesn't work */
        CHECK_F( BIT_initDStream(&bitD1, istart1, length1) );
        CHECK_F( BIT_initDStream(&bitD2, istart2, length2) );
        CHECK_F( BIT_initDStream(&bitD3, istart3, length3) );
        CHECK_F( BIT_initDStream(&bitD4, istart4, length4) );

        /* 16-32 symbols per loop (4-8 symbols per stream) */
        if ((size_t)(oend - op4) >= sizeof(size_t)) {
            for ( ; (endSignal) & (op4 < olimit); ) {
#if defined(__clang__) && (defined(__x86_64__) || defined(__i386__))
                HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_1(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_0(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_1(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_0(op2, &bitD2);
                endSignal &= BIT_reloadDStreamFast(&bitD1) == BIT_DStream_unfinished;
                endSignal &= BIT_reloadDStreamFast(&bitD2) == BIT_DStream_unfinished;
                HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_1(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_0(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_1(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_0(op4, &bitD4);
                endSignal &= BIT_reloadDStreamFast(&bitD3) == BIT_DStream_unfinished;
                endSignal &= BIT_reloadDStreamFast(&bitD4) == BIT_DStream_unfinished;
#else
                HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_1(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_1(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_1(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_1(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_2(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_2(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_2(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_2(op4, &bitD4);
                HUF_DECODE_SYMBOLX2_0(op1, &bitD1);
                HUF_DECODE_SYMBOLX2_0(op2, &bitD2);
                HUF_DECODE_SYMBOLX2_0(op3, &bitD3);
                HUF_DECODE_SYMBOLX2_0(op4, &bitD4);
                endSignal = (U32)LIKELY((U32)
                            (BIT_reloadDStreamFast(&bitD1) == BIT_DStream_unfinished)
                        & (BIT_reloadDStreamFast(&bitD2) == BIT_DStream_unfinished)
                        & (BIT_reloadDStreamFast(&bitD3) == BIT_DStream_unfinished)
                        & (BIT_reloadDStreamFast(&bitD4) == BIT_DStream_unfinished));
#endif
            }
        }

        /* check corruption */
        if (op1 > opStart2) return ERROR(corruption_detected);
        if (op2 > opStart3) return ERROR(corruption_detected);
        if (op3 > opStart4) return ERROR(corruption_detected);
        /* note : op4 already verified within main loop */

        /* finish bitStreams one by one */
        HUF_decodeStreamX2(op1, &bitD1, opStart2, dt, dtLog);
        HUF_decodeStreamX2(op2, &bitD2, opStart3, dt, dtLog);
        HUF_decodeStreamX2(op3, &bitD3, opStart4, dt, dtLog);
        HUF_decodeStreamX2(op4, &bitD4, oend,     dt, dtLog);

        /* check */
        { U32 const endCheck = BIT_endOfDStream(&bitD1) & BIT_endOfDStream(&bitD2) & BIT_endOfDStream(&bitD3) & BIT_endOfDStream(&bitD4);
          if (!endCheck) return ERROR(corruption_detected); }

        /* decoded size */
        return dstSize;
    }
}